

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

bool __thiscall ftxui::MenuBase::OnEvent(MenuBase *this,Event *event)

{
  ConstStringListRef *this_00;
  int iVar1;
  MenuOption *pMVar2;
  Ref<int> *pRVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  Ref<int> *pRVar9;
  int iVar10;
  MenuOption *pMVar11;
  function<void_()> *this_01;
  string *__lhs;
  Event local_b0;
  undefined1 local_70 [64];
  
  ComponentBase::CaptureMouse((ComponentBase *)&local_b0,(Event *)this);
  if ((_func_int **)local_b0._0_8_ == (_func_int **)0x0) {
    return false;
  }
  (**(code **)(*(_func_int **)local_b0._0_8_ + 8))();
  if (event->type_ == Mouse) {
    Event::Event((Event *)local_70,event);
    bVar4 = OnMouseEvent(this,(Event *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x18));
    return bVar4;
  }
  bVar4 = ComponentBase::Focused(&this->super_ComponentBase);
  if (!bVar4) {
    return false;
  }
  iVar1 = *this->selected_;
  __lhs = &event->input_;
  _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::ArrowUp + 0x18));
  if (_Var5) {
LAB_001338e8:
    *this->selected_ = *this->selected_ + -1;
  }
  else {
    Event::Character(&local_b0,'k');
    _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_b0 + 0x18U));
    std::__cxx11::string::~string((string *)((long)&local_b0 + 0x18U));
    if (_Var5) goto LAB_001338e8;
  }
  _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::ArrowDown + 0x18));
  if (!_Var5) {
    Event::Character(&local_b0,'j');
    _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_b0 + 0x18U));
    std::__cxx11::string::~string((string *)((long)&local_b0 + 0x18U));
    if (!_Var5) goto LAB_00133937;
  }
  *this->selected_ = *this->selected_ + 1;
LAB_00133937:
  _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::Tab + 0x18));
  if (_Var5) {
    sVar7 = ConstStringListRef::size(&this->entries_);
    if (sVar7 != 0) {
      iVar10 = *this->selected_;
      sVar7 = ConstStringListRef::size(&this->entries_);
      *this->selected_ = (int)(((long)iVar10 + 1U) % sVar7);
    }
  }
  _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::TabReverse + 0x18));
  if (_Var5) {
    this_00 = &this->entries_;
    sVar7 = ConstStringListRef::size(this_00);
    if (sVar7 != 0) {
      iVar10 = *this->selected_;
      sVar7 = ConstStringListRef::size(this_00);
      sVar8 = ConstStringListRef::size(this_00);
      *this->selected_ = (int)((((long)iVar10 + sVar7) - 1) % sVar8);
    }
  }
  sVar7 = ConstStringListRef::size(&this->entries_);
  iVar6 = (int)sVar7 + -1;
  iVar10 = *this->selected_;
  if (iVar10 < iVar6) {
    iVar6 = iVar10;
  }
  iVar10 = 0;
  if (0 < iVar6) {
    iVar10 = iVar6;
  }
  *this->selected_ = iVar10;
  if (iVar10 == iVar1) {
    _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(Event::Return + 0x18));
    if (!_Var5) {
      return false;
    }
    pMVar2 = (this->option_).address_;
    pMVar11 = &(this->option_).owned_;
    if (pMVar2 != (MenuOption *)0x0) {
      pMVar11 = pMVar2;
    }
    this_01 = &pMVar11->on_enter;
  }
  else {
    pMVar2 = (this->option_).address_;
    pMVar11 = &(this->option_).owned_;
    if (pMVar2 != (MenuOption *)0x0) {
      pMVar11 = pMVar2;
    }
    pRVar3 = (Ref<int> *)(pMVar11->focused_entry).address_;
    pRVar9 = &pMVar11->focused_entry;
    if (pRVar3 != (Ref<int> *)0x0) {
      pRVar9 = pRVar3;
    }
    pRVar9->owned_ = iVar10;
    this_01 = &pMVar11->on_change;
  }
  std::function<void_()>::operator()(this_01);
  return true;
}

Assistant:

bool OnEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (!Focused())
      return false;

    int old_selected = *selected_;
    if (event == Event::ArrowUp || event == Event::Character('k'))
      (*selected_)--;
    if (event == Event::ArrowDown || event == Event::Character('j'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (*selected_ != old_selected) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }